

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O3

Am_Time am_Handle_Timing_Events(void)

{
  Am_Time *this;
  Am_Slot_Key key;
  Am_Timer_Method_Type *pAVar1;
  bool bVar2;
  Am_Timer_State *pAVar3;
  undefined7 extraout_var;
  Am_Value *pAVar4;
  Am_Interactor_Time_Event *new_event;
  Am_Time_Data *extraout_RAX;
  byte bVar5;
  Am_Time *in_RDI;
  Am_Object method_object;
  Am_Time inter_start_time;
  Am_Time elapsed_time;
  Am_Time now;
  Am_Time next_timeout_time;
  Am_Timer_Method method;
  Am_Object local_80;
  Am_Time local_78;
  Am_Time local_70;
  Am_Time local_68;
  Am_Time *local_60;
  Am_Object local_58;
  Am_Time local_50;
  Am_Timer_Method local_48;
  Am_Time local_38;
  
  local_60 = in_RDI;
  Am_Time::Am_Time(in_RDI);
  pAVar3 = &Am_Global_Timer_State;
  if (Am_Global_Timer_State != Am_TIMERS_SUSPENDED) {
    bVar2 = Am_Value_List::Empty(&am_timing_events);
    pAVar3 = (Am_Timer_State *)CONCAT71(extraout_var,bVar2);
    if (!bVar2) {
      local_48.from_wrapper = (Am_Method_Wrapper *)0x0;
      local_48.Call = (Am_Timer_Method_Type *)0x0;
      Am_Time::Am_Time(&local_50);
      am_clock();
      Am_Time::Am_Time(&local_70);
      local_80.data = (Am_Object_Data *)0x0;
      Am_Time::Am_Time(&local_78);
      bVar5 = 0;
      while( true ) {
        Am_Value_List::Start(&am_timing_events);
        bVar2 = Am_Value_List::Empty(&am_timing_events);
        if (bVar2) break;
        pAVar4 = Am_Value_List::Get(&am_timing_events);
        new_event = (Am_Interactor_Time_Event *)Am_Value::operator_cast_to_void_(pAVar4);
        this = &new_event->next_timeout;
        bVar2 = Am_Time::operator<(this,&local_68);
        if (!bVar2) {
          if ((bool)(bVar5 & Am_Global_Timer_State == Am_TIMERS_SINGLE_STEP)) {
            Am_Set_Timer_State(Am_TIMERS_SUSPENDED);
          }
          Am_Time::operator=(local_60,this);
          break;
        }
        Am_Time::operator+=(this,&new_event->delta);
        Am_Value_List::Delete(&am_timing_events,true);
        Am_Object::operator=(&local_80,(Am_Object *)new_event);
        key = new_event->method_slot;
        Am_Time::operator=(&local_78,&new_event->start_time);
        if (new_event->only_once == true) {
          Am_Time::~Am_Time(&new_event->start_time);
          Am_Time::~Am_Time(this);
          Am_Time::~Am_Time(&new_event->delta);
          Am_Object::~Am_Object((Am_Object *)new_event);
          operator_delete(new_event);
        }
        else {
          am_add_timing_event(new_event);
        }
        bVar2 = Am_Object::Valid(&local_80);
        bVar5 = 1;
        if (bVar2) {
          pAVar4 = Am_Object::Get(&local_80,key,0);
          Am_Timer_Method::operator=(&local_48,pAVar4);
          if (local_48.Call != (Am_Timer_Method_Type *)0x0) {
            Am_Time::operator-(&local_38,&local_68);
            Am_Time::operator=(&local_70,&local_38);
            Am_Time::~Am_Time(&local_38);
            pAVar1 = local_48.Call;
            Am_Object::Am_Object(&local_58,&local_80);
            (*pAVar1)((Am_Object_Data *)&local_58,&local_70);
            Am_Object::~Am_Object(&local_58);
          }
        }
      }
      Am_Time::~Am_Time(&local_78);
      Am_Object::~Am_Object(&local_80);
      Am_Time::~Am_Time(&local_70);
      Am_Time::~Am_Time(&local_68);
      Am_Time::~Am_Time(&local_50);
      pAVar3 = (Am_Timer_State *)extraout_RAX;
    }
  }
  return (Am_Time)pAVar3;
}

Assistant:

static Am_Time
am_Handle_Timing_Events()
{
  bool ticked = false;
  Am_Time return_time; // next deadline
  if (Am_Global_Timer_State != Am_TIMERS_SUSPENDED &&
      !am_timing_events.Empty()) {
    Am_Timer_Method method;
    Am_Time next_timeout_time;
    Am_Time now = am_clock();
    Am_Interactor_Time_Event *next_event;
    Am_Time elapsed_time;

    Am_Object method_object;
    Am_Slot_Key method_slot;
    Am_Time inter_start_time;
    while (true) { // stop when the next event is not past
      am_timing_events.Start();
      if (am_timing_events.Empty()) {
        //deleted the last event
        return return_time; // will be uninitialized
      }
      next_event = (Am_Interactor_Time_Event *)(Am_Ptr)am_timing_events.Get();
      if (next_event->next_timeout < now) {
        // Deal with moving the timing event in its queue _before_ we
        // call the method.  The method might call Am_Stop_Timer,
        // removing this event from the queue, which deletes it.
        next_event->next_timeout += next_event->delta;
        am_timing_events.Delete();
        method_object = next_event->object;
        method_slot = next_event->method_slot;
        inter_start_time = next_event->start_time;
        if (next_event->only_once)
          delete next_event;
        else
          am_add_timing_event(next_event);
        if (method_object.Valid()) {
          //  Call the method for this object
          method = method_object.Get(method_slot);
          if (method.Valid()) {
            elapsed_time = now - inter_start_time;
            method.Call(method_object, elapsed_time);
          }
        }
        ticked = true;
      } else
        break;
    }

    if (ticked && Am_Global_Timer_State == Am_TIMERS_SINGLE_STEP)
      Am_Set_Timer_State(Am_TIMERS_SUSPENDED);

    return_time = next_event->next_timeout;
  }
  return return_time;
}